

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeGetLinWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int error_code;
  char *msgfmt;
  int iVar4;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x496;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x128) == 0) {
      *leniw = 0;
      *lenrw = 0;
      return 0;
    }
    lVar3 = (**(code **)((long)arkode_mem + 0x140))(arkode_mem);
    if (lVar3 != 0) {
      *lenrw = 3;
      *leniw = 0x1e;
      if (*(long *)(*(long *)(*(long *)(lVar3 + 0x58) + 8) + 0x20) != 0) {
        N_VSpace(*(long *)(lVar3 + 0x58),&local_30,&local_38);
        *lenrw = *lenrw + local_30 * 2;
        *leniw = *leniw + local_38 * 2;
      }
      lVar1 = *(long *)(lVar3 + 0x48);
      if (((lVar1 != 0) && (*(long *)(*(long *)(lVar1 + 8) + 0x50) != 0)) &&
         (iVar2 = SUNMatSpace(lVar1,&local_40,&local_48), iVar2 == 0)) {
        *lenrw = *lenrw + local_40;
        *leniw = *leniw + local_48;
      }
      if (*(long *)(*(long *)(*(long *)(lVar3 + 0x38) + 8) + 0x60) == 0) {
        return 0;
      }
      iVar2 = SUNLinSolSpace(*(long *)(lVar3 + 0x38),&local_40,&local_48);
      if (iVar2 != 0) {
        return 0;
      }
      *lenrw = *lenrw + local_40;
      *leniw = *leniw + local_48;
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    iVar4 = -2;
    error_code = -2;
    iVar2 = 0xff8;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar2,"ARKodeGetLinWorkSpace",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int ARKodeGetLinWorkSpace(void* arkode_mem, long int* lenrw, long int* leniw)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_implicit)
  {
    *lenrw = *leniw = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrw = 3;
  *leniw = 30;

  /* add NVector sizes */
  if (arkls_mem->x->ops->nvspace)
  {
    N_VSpace(arkls_mem->x, &lrw1, &liw1);
    *lenrw += 2 * lrw1;
    *leniw += 2 * liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (arkls_mem->savedJ)
  {
    if (arkls_mem->savedJ->ops->space)
    {
      retval = SUNMatSpace(arkls_mem->savedJ, &lrw, &liw);
      if (retval == 0)
      {
        *lenrw += lrw;
        *leniw += liw;
      }
    }
  }

  /* add LS sizes */
  if (arkls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(arkls_mem->LS, &lrw, &liw);
    if (retval == SUN_SUCCESS)
    {
      *lenrw += lrw;
      *leniw += liw;
    }
  }

  return (ARKLS_SUCCESS);
}